

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

ssize_t __thiscall DomFont::write(DomFont *this,int __fd,void *__buf,size_t __n)

{
  char16_t *pcVar1;
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar2;
  long in_FS_OFFSET;
  QAnyStringView QVar3;
  QAnyStringView QVar4;
  QAnyStringView QVar5;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  QAnyStringView QVar12;
  QAnyStringView QVar13;
  QAnyStringView QVar14;
  QAnyStringView QVar15;
  QAnyStringView QVar16;
  QAnyStringView QVar17;
  QAnyStringView QVar18;
  QAnyStringView QVar19;
  QAnyStringView QVar20;
  QAnyStringView QVar21;
  QAnyStringView QVar22;
  QAnyStringView QVar23;
  QAnyStringView QVar24;
  QAnyStringView QVar25;
  QAnyStringView QVar26;
  QAnyStringView QVar27;
  QString local_40;
  long local_28;
  
  aVar2._4_4_ = in_register_00000034;
  aVar2._0_4_ = __fd;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)((long)__buf + 0x10) == 0) {
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"font";
    local_40.d.size = 4;
  }
  else {
    QString::toLower_helper(&local_40);
  }
  QVar3.m_size = (size_t)local_40.d.ptr;
  QVar3.field_0.m_data = aVar2.m_data;
  QXmlStreamWriter::writeStartElement(QVar3);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((this->m_children & 1) != 0) {
    QVar4.m_size = (size_t)L"family";
    QVar4.field_0.m_data = aVar2.m_data;
    QVar16.m_size = (size_t)(this->m_family).d.ptr;
    QVar16.field_0.m_data = (void *)0x8000000000000006;
    QXmlStreamWriter::writeTextElement(QVar4,QVar16);
  }
  if ((this->m_children & 2) != 0) {
    QString::number((int)&local_40,this->m_pointSize);
    QVar5.m_size = (size_t)L"pointsize";
    QVar5.field_0.m_data = aVar2.m_data;
    QVar17.m_size = (size_t)local_40.d.ptr;
    QVar17.field_0.m_data = (void *)0x8000000000000009;
    QXmlStreamWriter::writeTextElement(QVar5,QVar17);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((this->m_children & 4) != 0) {
    QString::number((int)&local_40,this->m_weight);
    QVar6.m_size = (size_t)L"weight";
    QVar6.field_0.m_data = aVar2.m_data;
    QVar18.m_size = (size_t)local_40.d.ptr;
    QVar18.field_0.m_data = (void *)0x8000000000000006;
    QXmlStreamWriter::writeTextElement(QVar6,QVar18);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((this->m_children & 8) != 0) {
    pcVar1 = L"false";
    if (this->m_italic != false) {
      pcVar1 = L"true";
    }
    QVar7.m_size = (size_t)L"italic";
    QVar7.field_0.m_data = aVar2.m_data;
    QVar19.m_size = (size_t)pcVar1;
    QVar19.field_0.m_data = (void *)0x8000000000000006;
    QXmlStreamWriter::writeTextElement(QVar7,QVar19);
  }
  if ((this->m_children & 0x10) != 0) {
    pcVar1 = L"false";
    if (this->m_bold != false) {
      pcVar1 = L"true";
    }
    QVar8.m_size = (size_t)L"bold";
    QVar8.field_0.m_data = aVar2.m_data;
    QVar20.m_size = (size_t)pcVar1;
    QVar20.field_0.m_data = (void *)0x8000000000000004;
    QXmlStreamWriter::writeTextElement(QVar8,QVar20);
  }
  if ((this->m_children & 0x20) != 0) {
    pcVar1 = L"false";
    if (this->m_underline != false) {
      pcVar1 = L"true";
    }
    QVar9.m_size = (size_t)L"underline";
    QVar9.field_0.m_data = aVar2.m_data;
    QVar21.m_size = (size_t)pcVar1;
    QVar21.field_0.m_data = (void *)0x8000000000000009;
    QXmlStreamWriter::writeTextElement(QVar9,QVar21);
  }
  if ((this->m_children & 0x40) != 0) {
    pcVar1 = L"false";
    if (this->m_strikeOut != false) {
      pcVar1 = L"true";
    }
    QVar10.m_size = (size_t)L"strikeout";
    QVar10.field_0.m_data = aVar2.m_data;
    QVar22.m_size = (size_t)pcVar1;
    QVar22.field_0.m_data = (void *)0x8000000000000009;
    QXmlStreamWriter::writeTextElement(QVar10,QVar22);
  }
  if ((this->m_children & 0x80) != 0) {
    pcVar1 = L"false";
    if (this->m_antialiasing != false) {
      pcVar1 = L"true";
    }
    QVar11.m_size = (size_t)L"antialiasing";
    QVar11.field_0.m_data = aVar2.m_data;
    QVar23.m_size = (size_t)pcVar1;
    QVar23.field_0.m_data = (void *)0x800000000000000c;
    QXmlStreamWriter::writeTextElement(QVar11,QVar23);
  }
  if ((this->m_children & 0x100) != 0) {
    QVar12.m_size = (size_t)L"stylestrategy";
    QVar12.field_0.m_data = aVar2.m_data;
    QVar24.m_size = (size_t)(this->m_styleStrategy).d.ptr;
    QVar24.field_0.m_data = (void *)0x800000000000000d;
    QXmlStreamWriter::writeTextElement(QVar12,QVar24);
  }
  if ((this->m_children & 0x200) != 0) {
    pcVar1 = L"false";
    if (this->m_kerning != false) {
      pcVar1 = L"true";
    }
    QVar13.m_size = (size_t)L"kerning";
    QVar13.field_0.m_data = aVar2.m_data;
    QVar25.m_size = (size_t)pcVar1;
    QVar25.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(void *)0x8000000000000007;
    QXmlStreamWriter::writeTextElement(QVar13,QVar25);
  }
  if ((this->m_children & 0x400) != 0) {
    QVar14.m_size = (size_t)L"hintingpreference";
    QVar14.field_0.m_data = aVar2.m_data;
    QVar26.m_size = (size_t)(this->m_hintingPreference).d.ptr;
    QVar26.field_0.m_data = (void *)0x8000000000000011;
    QXmlStreamWriter::writeTextElement(QVar14,QVar26);
  }
  if ((this->m_children & 0x800) != 0) {
    QVar15.m_size = (size_t)L"fontweight";
    QVar15.field_0.m_data = aVar2.m_data;
    QVar27.m_size = (size_t)(this->m_fontWeight).d.ptr;
    QVar27.field_0.m_data = (void *)0x800000000000000a;
    QXmlStreamWriter::writeTextElement(QVar15,QVar27);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomFont::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("font") : tagName.toLower());

    if (m_children & Family)
        writer.writeTextElement(u"family"_s, m_family);

    if (m_children & PointSize)
        writer.writeTextElement(u"pointsize"_s, QString::number(m_pointSize));

    if (m_children & Weight)
        writer.writeTextElement(u"weight"_s, QString::number(m_weight));

    if (m_children & Italic)
        writer.writeTextElement(u"italic"_s, (m_italic ? u"true"_s : u"false"_s));

    if (m_children & Bold)
        writer.writeTextElement(u"bold"_s, (m_bold ? u"true"_s : u"false"_s));

    if (m_children & Underline)
        writer.writeTextElement(u"underline"_s, (m_underline ? u"true"_s : u"false"_s));

    if (m_children & StrikeOut)
        writer.writeTextElement(u"strikeout"_s, (m_strikeOut ? u"true"_s : u"false"_s));

    if (m_children & Antialiasing)
        writer.writeTextElement(u"antialiasing"_s, (m_antialiasing ? u"true"_s : u"false"_s));

    if (m_children & StyleStrategy)
        writer.writeTextElement(u"stylestrategy"_s, m_styleStrategy);

    if (m_children & Kerning)
        writer.writeTextElement(u"kerning"_s, (m_kerning ? u"true"_s : u"false"_s));

    if (m_children & HintingPreference)
        writer.writeTextElement(u"hintingpreference"_s, m_hintingPreference);

    if (m_children & FontWeight)
        writer.writeTextElement(u"fontweight"_s, m_fontWeight);

    writer.writeEndElement();
}